

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.hpp
# Opt level: O3

void __thiscall Propagator::add_to_propagator(Propagator *this,uint y,uint x,uint pattern)

{
  pointer paVar1;
  uint local_c;
  uint local_8;
  uint local_4;
  
  paVar1 = (this->compatible).data.
           super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl.
           super__Vector_impl_data._M_start +
           ((ulong)y * (this->compatible).width + (ulong)x) * (this->compatible).depth +
           (ulong)pattern;
  paVar1->_M_elems[0] = 0;
  paVar1->_M_elems[1] = 0;
  paVar1->_M_elems[2] = 0;
  paVar1->_M_elems[3] = 0;
  local_c = pattern;
  local_8 = x;
  local_4 = y;
  std::
  vector<std::tuple<unsigned_int,unsigned_int,unsigned_int>,std::allocator<std::tuple<unsigned_int,unsigned_int,unsigned_int>>>
  ::emplace_back<unsigned_int&,unsigned_int&,unsigned_int&>
            ((vector<std::tuple<unsigned_int,unsigned_int,unsigned_int>,std::allocator<std::tuple<unsigned_int,unsigned_int,unsigned_int>>>
              *)&this->propagating,&local_4,&local_8,&local_c);
  return;
}

Assistant:

void add_to_propagator(unsigned y, unsigned x, unsigned pattern) noexcept {
    // All the direction are set to 0, since the pattern cannot be set in (y,x).
    std::array<int, 4> temp = {};
    compatible.get(y, x, pattern) = temp;
    propagating.emplace_back(y, x, pattern);
  }